

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int __thiscall icu_63::MessagePattern::init(MessagePattern *this,EVP_PKEY_CTX *ctx)

{
  Part *pPVar1;
  int iVar2;
  MessagePatternPartsList *__s;
  
  if (0 < *(int *)ctx) {
    return 0;
  }
  __s = (MessagePatternPartsList *)UMemory::operator_new((UMemory *)0x210,(size_t)ctx);
  if (__s == (MessagePatternPartsList *)0x0) {
    __s = (MessagePatternPartsList *)0x0;
  }
  else {
    memset(__s,0,0x210);
    (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr =
         (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.stackArray;
    (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.capacity = 0x20;
    (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.needToRelease = '\0';
  }
  this->partsList = __s;
  if (__s == (MessagePatternPartsList *)0x0) {
    *(undefined4 *)ctx = 7;
    iVar2 = 0;
  }
  else {
    pPVar1 = (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr;
    this->parts = pPVar1;
    iVar2 = (int)CONCAT71((int7)((ulong)pPVar1 >> 8),1);
  }
  return iVar2;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }